

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O2

int ReadColorMap(gdIOCtx *fd,int number,uchar (*buffer) [256])

{
  int iVar1;
  undefined8 in_RAX;
  ulong uVar2;
  ulong uVar3;
  undefined8 uStack_38;
  uchar rgb [3];
  
  uVar3 = (ulong)(uint)number;
  if (number < 1) {
    uVar3 = 0;
  }
  uVar2 = 0;
  uStack_38 = in_RAX;
  while( true ) {
    if (uVar3 == uVar2) {
      return 0;
    }
    iVar1 = gdGetBuf(rgb,3,fd);
    if (iVar1 < 1) break;
    (*buffer)[uVar2] = rgb[0];
    buffer[1][uVar2] = rgb[1];
    buffer[2][uVar2] = rgb[2];
    uVar2 = uVar2 + 1;
  }
  return 1;
}

Assistant:

static int
ReadColorMap(gdIOCtx *fd, int number, unsigned char (*buffer)[256])
{
	int i;
	unsigned char rgb[3];

	for(i = 0; i < number; ++i) {
		if(!ReadOK(fd, rgb, sizeof(rgb))) {
			return TRUE;
		}

		buffer[CM_RED][i] = rgb[0];
		buffer[CM_GREEN][i] = rgb[1];
		buffer[CM_BLUE][i] = rgb[2];
	}

	return FALSE;
}